

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int resolveCompoundOrderBy(Parse *pParse,Select *pSelect)

{
  byte *pbVar1;
  u8 uVar2;
  bool bVar3;
  Select *pSVar4;
  Select *pSVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  Expr *pEVar10;
  long lVar11;
  Expr *pE;
  ExprList_item *pEVar12;
  ulong uVar13;
  sqlite3 *psVar14;
  ExprList *pEVar15;
  int iVar16;
  Expr *p;
  ExprList_item *pEVar17;
  int iCol;
  int local_a8;
  int local_a4;
  sqlite3 *local_a0;
  ExprList_item *local_98;
  Expr *local_90;
  Select *local_88;
  Parse *local_80;
  ExprList *local_78;
  Parse *local_70;
  NameContext local_68;
  
  pEVar15 = pSelect->pOrderBy;
  if (pEVar15 == (ExprList *)0x0) {
    return 0;
  }
  local_a0 = pParse->db;
  if (local_a0->aLimit[2] < pEVar15->nExpr) {
    sqlite3ErrorMsg(pParse,"too many terms in ORDER BY clause");
  }
  else {
    if (0 < pEVar15->nExpr) {
      lVar9 = 0x19;
      lVar11 = 0;
      do {
        pbVar1 = (byte *)((long)&pEVar15->a->pExpr + lVar9);
        *pbVar1 = *pbVar1 & 0xfe;
        lVar11 = lVar11 + 1;
        lVar9 = lVar9 + 0x20;
      } while (lVar11 < pEVar15->nExpr);
    }
    pSelect->pNext = (Select *)0x0;
    pSVar5 = pSelect->pPrior;
    while (pSVar4 = pSVar5, pSVar4 != (Select *)0x0) {
      pSVar4->pNext = pSelect;
      pSelect = pSVar4;
      pSVar5 = pSVar4->pPrior;
    }
    iVar16 = 1;
    local_80 = pParse;
    local_78 = pEVar15;
    do {
      if ((pSelect == (Select *)0x0) || (iVar16 == 0)) {
        if ((long)pEVar15->nExpr < 1) {
          return 0;
        }
        uVar13 = 1;
        lVar9 = 0;
        do {
          if (((&pEVar15->a->field_0x19)[lVar9] & 1) == 0) {
            sqlite3ErrorMsg(local_80,"%r ORDER BY term does not match any column in the result set",
                            uVar13);
            return 1;
          }
          uVar13 = (ulong)((int)uVar13 + 1);
          lVar9 = lVar9 + 0x20;
        } while ((long)pEVar15->nExpr * 0x20 != lVar9);
        return 0;
      }
      local_88 = pSelect;
      if (pEVar15->nExpr < 1) {
        local_a4 = 0;
      }
      else {
        local_70 = (Parse *)pSelect->pEList;
        pEVar17 = pEVar15->a;
        iVar16 = 0;
        local_a4 = 0;
        do {
          local_a8 = -1;
          if ((pEVar17->field_0x19 & 1) == 0) {
            for (p = pEVar17->pExpr; (p != (Expr *)0x0 && ((p->op == '\\' || (p->op == '\x18'))));
                p = p->pLeft) {
            }
            iVar6 = sqlite3ExprIsInteger(p,&local_a8);
            if (iVar6 == 0) {
              local_a8 = resolveAsName(local_70,(ExprList *)p,pE);
              psVar14 = local_a0;
              if (local_a8 == 0) {
                pEVar10 = exprDup(local_a0,p,0,(u8 **)0x0);
                iVar6 = local_a8;
                if (psVar14->mallocFailed == '\0') {
                  local_98 = (ExprList_item *)local_88->pEList;
                  local_68.pNext = (NameContext *)0x0;
                  local_68.pAggInfo = (AggInfo *)0x0;
                  local_68.pParse = local_80;
                  local_68.pSrcList = local_88->pSrc;
                  local_68.ncFlags = '\x01';
                  local_68._49_7_ = 0;
                  local_68.nRef = 0;
                  local_68.nErr = 0;
                  psVar14 = local_80->db;
                  uVar2 = psVar14->suppressErr;
                  psVar14->suppressErr = '\x01';
                  local_68.pEList = (ExprList *)local_98;
                  iVar7 = sqlite3ResolveExprNames(&local_68,pEVar10);
                  psVar14->suppressErr = uVar2;
                  psVar14 = local_a0;
                  iVar6 = 0;
                  if ((iVar7 == 0) && (iVar7 = *(int *)&local_98->pExpr, 0 < (long)iVar7)) {
                    local_98 = (ExprList_item *)local_98->zName;
                    iVar6 = 1;
                    lVar9 = 0;
                    local_90 = pEVar10;
                    do {
                      uVar8 = sqlite3ExprCompare(*(Expr **)((long)&local_98->pExpr + lVar9),local_90
                                                );
                      psVar14 = local_a0;
                      pEVar10 = local_90;
                      if (uVar8 < 2) goto LAB_00187c10;
                      iVar6 = iVar6 + 1;
                      lVar9 = lVar9 + 0x20;
                    } while ((long)iVar7 * 0x20 != lVar9);
                    iVar6 = 0;
                  }
                }
LAB_00187c10:
                local_a8 = iVar6;
                sqlite3ExprDelete(psVar14,pEVar10);
              }
            }
            else if ((local_a8 < 1) || (*(int *)&local_70->db < local_a8)) {
              bVar3 = false;
              sqlite3ErrorMsg(local_80,"%r %s BY term out of range - should be between 1 and %d",
                              (ulong)(iVar16 + 1),"ORDER",(ulong)*(uint *)&local_70->db);
              iVar6 = 1;
              goto LAB_00187cb5;
            }
            psVar14 = local_a0;
            iVar6 = local_a8;
            if (local_a8 < 1) {
              local_a4 = 1;
            }
            else {
              local_68.pParse = (Parse *)0x0;
              local_68.pSrcList = (SrcList *)((ulong)local_68.pSrcList & 0xffffffff00000000);
              pEVar10 = sqlite3ExprAlloc(local_a0,0x81,(Token *)&local_68,0);
              if (pEVar10 == (Expr *)0x0) {
                iVar6 = 1;
                bVar3 = false;
                pEVar15 = local_78;
                goto LAB_00187cb5;
              }
              pbVar1 = (byte *)((long)&pEVar10->flags + 1);
              *pbVar1 = *pbVar1 | 4;
              (pEVar10->u).iValue = iVar6;
              pEVar12 = (ExprList_item *)&pEVar17->pExpr->pLeft;
              if (pEVar17->pExpr == p) {
                pEVar12 = pEVar17;
              }
              pEVar12->pExpr = pEVar10;
              sqlite3ExprDelete(psVar14,p);
              pEVar17->iOrderByCol = (u16)local_a8;
              pEVar17->field_0x19 = pEVar17->field_0x19 | 1;
            }
            iVar6 = 0;
            bVar3 = true;
            pEVar15 = local_78;
          }
          else {
            iVar6 = 0xb;
            bVar3 = false;
          }
LAB_00187cb5:
          if ((iVar6 != 0xb) && (pSelect = local_88, iVar6 != 0)) goto LAB_00187d59;
          iVar16 = iVar16 + 1;
          pEVar17 = pEVar17 + 1;
        } while (iVar16 < pEVar15->nExpr);
      }
      bVar3 = true;
      pSelect = local_88->pNext;
LAB_00187d59:
      iVar16 = local_a4;
    } while (bVar3);
  }
  return 1;
}

Assistant:

static int resolveCompoundOrderBy(
  Parse *pParse,        /* Parsing context.  Leave error messages here */
  Select *pSelect       /* The SELECT statement containing the ORDER BY */
){
  int i;
  ExprList *pOrderBy;
  ExprList *pEList;
  sqlite3 *db;
  int moreToDo = 1;

  pOrderBy = pSelect->pOrderBy;
  if( pOrderBy==0 ) return 0;
  db = pParse->db;
#if SQLITE_MAX_COLUMN
  if( pOrderBy->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many terms in ORDER BY clause");
    return 1;
  }
#endif
  for(i=0; i<pOrderBy->nExpr; i++){
    pOrderBy->a[i].done = 0;
  }
  pSelect->pNext = 0;
  while( pSelect->pPrior ){
    pSelect->pPrior->pNext = pSelect;
    pSelect = pSelect->pPrior;
  }
  while( pSelect && moreToDo ){
    struct ExprList_item *pItem;
    moreToDo = 0;
    pEList = pSelect->pEList;
    assert( pEList!=0 );
    for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
      int iCol = -1;
      Expr *pE, *pDup;
      if( pItem->done ) continue;
      pE = sqlite3ExprSkipCollate(pItem->pExpr);
      if( sqlite3ExprIsInteger(pE, &iCol) ){
        if( iCol<=0 || iCol>pEList->nExpr ){
          resolveOutOfRangeError(pParse, "ORDER", i+1, pEList->nExpr);
          return 1;
        }
      }else{
        iCol = resolveAsName(pParse, pEList, pE);
        if( iCol==0 ){
          pDup = sqlite3ExprDup(db, pE, 0);
          if( !db->mallocFailed ){
            assert(pDup);
            iCol = resolveOrderByTermToExprList(pParse, pSelect, pDup);
          }
          sqlite3ExprDelete(db, pDup);
        }
      }
      if( iCol>0 ){
        /* Convert the ORDER BY term into an integer column number iCol,
        ** taking care to preserve the COLLATE clause if it exists */
        Expr *pNew = sqlite3Expr(db, TK_INTEGER, 0);
        if( pNew==0 ) return 1;
        pNew->flags |= EP_IntValue;
        pNew->u.iValue = iCol;
        if( pItem->pExpr==pE ){
          pItem->pExpr = pNew;
        }else{
          assert( pItem->pExpr->op==TK_COLLATE );
          assert( pItem->pExpr->pLeft==pE );
          pItem->pExpr->pLeft = pNew;
        }
        sqlite3ExprDelete(db, pE);
        pItem->iOrderByCol = (u16)iCol;
        pItem->done = 1;
      }else{
        moreToDo = 1;
      }
    }
    pSelect = pSelect->pNext;
  }
  for(i=0; i<pOrderBy->nExpr; i++){
    if( pOrderBy->a[i].done==0 ){
      sqlite3ErrorMsg(pParse, "%r ORDER BY term does not match any "
            "column in the result set", i+1);
      return 1;
    }
  }
  return 0;
}